

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_bmilgl(uint32_t dst,uint32_t src1)

{
  target_long tVar1;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint32_t src1_local;
  uint32_t dst_local;
  
  tVar1 = lshift((ulong)dst,-0x18);
  return (uint)(src1 == 0) | (uint)(dst == 0) << 6 | (uint)tVar1 & 0x80;
}

Assistant:

static int glue(compute_all_bmilg, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1)
{
    int cf, pf, af, zf, sf, of;

    cf = (src1 == 0);
    pf = 0; /* undefined */
    af = 0; /* undefined */
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = 0;
    return cf | pf | af | zf | sf | of;
}